

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

PersistentColumnData *
duckdb::PersistentColumnData::Deserialize
          (PersistentColumnData *__return_storage_ptr__,Deserializer *deserializer)

{
  PhysicalType physical_type_p;
  _Elt_pointer prVar1;
  uint uVar2;
  int iVar3;
  LogicalType *pLVar4;
  child_list_t<LogicalType> *this;
  undefined4 extraout_var;
  const_reference pvVar5;
  size_type __n;
  PersistentColumnData val;
  pointer local_88;
  pointer pDStack_80;
  pointer local_78;
  vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_> local_48;
  
  pLVar4 = Deserializer::Get<duckdb::LogicalType_const&>(deserializer);
  physical_type_p = pLVar4->physical_type_;
  PersistentColumnData(__return_storage_ptr__,physical_type_p);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"data_pointers");
  if ((char)uVar2 == '\0') {
    local_78 = (__return_storage_ptr__->pointers).
               super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
               super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    local_88 = (__return_storage_ptr__->pointers).
               super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
               super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl
               .super__Vector_impl_data._M_start;
    pDStack_80 = (__return_storage_ptr__->pointers).
                 super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                 super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->pointers).
    super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
    super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->pointers).
    super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
    super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->pointers).
    super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
    super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    Deserializer::Read<duckdb::vector<duckdb::DataPointer,true>>((type *)&local_48,deserializer);
    local_78 = (__return_storage_ptr__->pointers).
               super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
               super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->pointers).
    super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
    super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88 = (__return_storage_ptr__->pointers).
               super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
               super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl
               .super__Vector_impl_data._M_start;
    pDStack_80 = (__return_storage_ptr__->pointers).
                 super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                 super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->pointers).
    super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
    super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->pointers).
    super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
    super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  local_48.super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>::~vector
            ((vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_> *)&local_88);
  ::std::vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>::~vector(&local_48);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  if (__return_storage_ptr__->physical_type == BIT) {
    return __return_storage_ptr__;
  }
  LogicalType::LogicalType((LogicalType *)&local_88,VALIDITY);
  DeserializeField(__return_storage_ptr__,deserializer,0x65,"validity",(LogicalType *)&local_88);
  LogicalType::~LogicalType((LogicalType *)&local_88);
  if (physical_type_p == LIST) {
    pLVar4 = ListType::GetChildType(pLVar4);
  }
  else {
    if (physical_type_p == STRUCT) {
      this = StructType::GetChildTypes_abi_cxx11_(pLVar4);
      (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"sub_columns");
      iVar3 = (*deserializer->_vptr_Deserializer[8])(deserializer);
      if (CONCAT44(extraout_var,iVar3) != 0) {
        __n = 0;
        do {
          pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                   ::operator[](this,__n);
          prVar1 = (deserializer->data).types.c.
                   super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (prVar1 == (deserializer->data).types.c.
                        super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            ::std::
            deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
            ::_M_push_back_aux<duckdb::LogicalType_const&>
                      ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                        *)&(deserializer->data).types,&pvVar5->second);
          }
          else {
            prVar1->_M_data = &pvVar5->second;
            (deserializer->data).types.c.
            super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur = prVar1 + 1;
          }
          (*deserializer->_vptr_Deserializer[6])(deserializer);
          Deserialize((PersistentColumnData *)&local_88,deserializer);
          (*deserializer->_vptr_Deserializer[7])(deserializer);
          ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
          ::emplace_back<duckdb::PersistentColumnData>
                    (&(__return_storage_ptr__->child_columns).
                      super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                     ,(PersistentColumnData *)&local_88);
          ~PersistentColumnData((PersistentColumnData *)&local_88);
          Deserializer::Unset<duckdb::LogicalType>(deserializer);
          __n = __n + 1;
        } while (CONCAT44(extraout_var,iVar3) != __n);
      }
      (*deserializer->_vptr_Deserializer[9])(deserializer);
      (*deserializer->_vptr_Deserializer[3])(deserializer);
      return __return_storage_ptr__;
    }
    if (physical_type_p != ARRAY) {
      return __return_storage_ptr__;
    }
    pLVar4 = ArrayType::GetChildType(pLVar4);
  }
  DeserializeField(__return_storage_ptr__,deserializer,0x66,"child_column",pLVar4);
  return __return_storage_ptr__;
}

Assistant:

PersistentColumnData PersistentColumnData::Deserialize(Deserializer &deserializer) {
	auto &type = deserializer.Get<const LogicalType &>();
	auto physical_type = type.InternalType();
	PersistentColumnData result(physical_type);
	deserializer.ReadPropertyWithDefault(100, "data_pointers", static_cast<vector<DataPointer> &>(result.pointers));
	if (result.physical_type == PhysicalType::BIT) {
		// validity: return
		return result;
	}
	result.DeserializeField(deserializer, 101, "validity", LogicalTypeId::VALIDITY);
	switch (physical_type) {
	case PhysicalType::ARRAY:
		result.DeserializeField(deserializer, 102, "child_column", ArrayType::GetChildType(type));
		break;
	case PhysicalType::LIST:
		result.DeserializeField(deserializer, 102, "child_column", ListType::GetChildType(type));
		break;
	case PhysicalType::STRUCT: {
		auto &child_types = StructType::GetChildTypes(type);
		deserializer.ReadList(102, "sub_columns", [&](Deserializer::List &list, idx_t i) {
			deserializer.Set<const LogicalType &>(child_types[i].second);
			result.child_columns.push_back(list.ReadElement<PersistentColumnData>());
			deserializer.Unset<LogicalType>();
		});
		break;
	}
	default:
		break;
	}
	return result;
}